

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O2

string * __thiscall
cmLocalNinjaGenerator::MakeCustomLauncher_abi_cxx11_
          (string *__return_storage_ptr__,cmLocalNinjaGenerator *this,cmCustomCommandGenerator *ccg)

{
  cmMakefile *this_00;
  int iVar1;
  char *pcVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  char *pcVar4;
  undefined4 extraout_var;
  auto_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander;
  string output;
  RuleVariables vars;
  allocator local_169;
  string local_168;
  string local_148;
  string local_128;
  RuleVariables local_108;
  
  this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  std::__cxx11::string::string((string *)&local_108,"RULE_LAUNCH_CUSTOM",(allocator *)&local_148);
  pcVar2 = cmMakefile::GetProperty(this_00,(string *)&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  if ((pcVar2 == (char *)0x0) || (*pcVar2 == '\0')) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    cmRulePlaceholderExpander::RuleVariables::RuleVariables(&local_108);
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    local_148._M_string_length = 0;
    local_148.field_2._M_local_buf[0] = '\0';
    pvVar3 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_(ccg);
    if ((pvVar3->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start !=
        (pvVar3->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::_M_assign((string *)&local_148);
      cmCustomCommandGenerator::GetWorkingDirectory_abi_cxx11_(&local_168,ccg);
      std::__cxx11::string::~string((string *)&local_168);
      if (local_168._M_string_length == 0) {
        pcVar4 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)this);
        std::__cxx11::string::string((string *)&local_128,pcVar4,&local_169);
        cmOutputConverter::ConvertToRelativePath
                  (&local_168,
                   &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,&local_128,&local_148);
        std::__cxx11::string::operator=((string *)&local_148,(string *)&local_168);
        std::__cxx11::string::~string((string *)&local_168);
        std::__cxx11::string::~string((string *)&local_128);
      }
      cmOutputConverter::ConvertToOutputFormat
                (&local_168,
                 &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,&local_148,SHELL);
      std::__cxx11::string::operator=((string *)&local_148,(string *)&local_168);
      std::__cxx11::string::~string((string *)&local_168);
    }
    local_108.Output = local_148._M_dataplus._M_p;
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,(allocator *)&local_168);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    iVar1 = (*(this->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[5])
                      (this);
    local_168._M_dataplus._M_p = (pointer)CONCAT44(extraout_var,iVar1);
    cmRulePlaceholderExpander::ExpandRuleVariables
              ((cmRulePlaceholderExpander *)local_168._M_dataplus._M_p,
               &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
               __return_storage_ptr__,&local_108);
    if (__return_storage_ptr__->_M_string_length != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    cm::auto_ptr<cmRulePlaceholderExpander>::~auto_ptr
              ((auto_ptr<cmRulePlaceholderExpander> *)&local_168);
    std::__cxx11::string::~string((string *)&local_148);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalNinjaGenerator::MakeCustomLauncher(
  cmCustomCommandGenerator const& ccg)
{
  const char* property_value =
    this->Makefile->GetProperty("RULE_LAUNCH_CUSTOM");

  if (!property_value || !*property_value) {
    return std::string();
  }

  // Expand rules in the empty string.  It may insert the launcher and
  // perform replacements.
  cmRulePlaceholderExpander::RuleVariables vars;

  std::string output;
  const std::vector<std::string>& outputs = ccg.GetOutputs();
  if (!outputs.empty()) {
    output = outputs[0];
    if (ccg.GetWorkingDirectory().empty()) {
      output =
        this->ConvertToRelativePath(this->GetCurrentBinaryDirectory(), output);
    }
    output = this->ConvertToOutputFormat(output, cmOutputConverter::SHELL);
  }
  vars.Output = output.c_str();

  std::string launcher = property_value;
  launcher += " ";

  CM_AUTO_PTR<cmRulePlaceholderExpander> rulePlaceholderExpander(
    this->CreateRulePlaceholderExpander());

  rulePlaceholderExpander->ExpandRuleVariables(this, launcher, vars);
  if (!launcher.empty()) {
    launcher += " ";
  }

  return launcher;
}